

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx::DiscMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar9;
  uint uVar10;
  undefined4 uVar11;
  RTCRayN *pRVar12;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar38;
  float fVar39;
  undefined1 auVar35 [16];
  float fVar40;
  undefined1 auVar36 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [64];
  float fVar48;
  undefined1 auVar49 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [64];
  float fVar54;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar55 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vbool<4> valid;
  undefined1 local_1a8 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [4];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  ulong uVar13;
  undefined1 auVar37 [64];
  undefined1 auVar69 [64];
  
  pSVar5 = context->scene;
  uVar13 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar6 = (pSVar5->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar6->time_range).lower;
  fVar1 = pGVar6->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar6->time_range).upper - fVar1));
  auVar27 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar27 = vminss_avx(auVar27,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar27 = vmaxss_avx(ZEXT816(0) << 0x20,auVar27);
  fVar1 = fVar1 - auVar27._0_4_;
  lVar14 = *(long *)&pGVar6[2].numPrimitives;
  lVar15 = (long)(int)auVar27._0_4_ * 0x38;
  lVar7 = *(long *)(lVar14 + lVar15);
  lVar8 = *(long *)(lVar14 + 0x10 + lVar15);
  auVar27 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar13);
  uVar16 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar28 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar16);
  uVar17 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar68 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar17);
  uVar18 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar49 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar18);
  auVar35 = vunpcklps_avx(auVar27,auVar68);
  auVar24 = vunpckhps_avx(auVar27,auVar68);
  auVar27 = vunpcklps_avx(auVar28,auVar49);
  auVar25 = vunpckhps_avx(auVar28,auVar49);
  auVar30 = vunpcklps_avx(auVar35,auVar27);
  auVar35 = vunpckhps_avx(auVar35,auVar27);
  auVar20 = vunpcklps_avx(auVar24,auVar25);
  lVar7 = *(long *)(lVar14 + 0x38 + lVar15);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar15);
  auVar27 = *(undefined1 (*) [16])(lVar7 + uVar13 * lVar14);
  auVar28 = *(undefined1 (*) [16])(lVar7 + uVar16 * lVar14);
  auVar68 = *(undefined1 (*) [16])(lVar7 + uVar17 * lVar14);
  auVar49 = *(undefined1 (*) [16])(lVar7 + lVar14 * uVar18);
  auVar60 = vunpcklps_avx(auVar27,auVar68);
  auVar31 = vunpckhps_avx(auVar27,auVar68);
  auVar27 = vunpcklps_avx(auVar28,auVar49);
  auVar33 = vunpckhps_avx(auVar28,auVar49);
  auVar28 = vunpcklps_avx(auVar60,auVar27);
  auVar27 = vunpckhps_avx(auVar60,auVar27);
  auVar60 = vunpcklps_avx(auVar31,auVar33);
  auVar68 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar49 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar59._8_4_ = 0x3f800000;
  auVar59._0_8_ = 0x3f8000003f800000;
  auVar59._12_4_ = 0x3f800000;
  fVar19 = auVar68._0_4_;
  fVar21 = auVar68._4_4_;
  fVar22 = auVar68._8_4_;
  fVar23 = auVar68._12_4_;
  fVar48 = auVar49._0_4_;
  fVar51 = auVar49._4_4_;
  fVar52 = auVar49._8_4_;
  fVar53 = auVar49._12_4_;
  auVar26._0_4_ = fVar48 * auVar30._0_4_ + fVar19 * auVar28._0_4_;
  auVar26._4_4_ = fVar51 * auVar30._4_4_ + fVar21 * auVar28._4_4_;
  auVar26._8_4_ = fVar52 * auVar30._8_4_ + fVar22 * auVar28._8_4_;
  auVar26._12_4_ = fVar53 * auVar30._12_4_ + fVar23 * auVar28._12_4_;
  auVar30._0_4_ = fVar19 * auVar27._0_4_ + fVar48 * auVar35._0_4_;
  auVar30._4_4_ = fVar21 * auVar27._4_4_ + fVar51 * auVar35._4_4_;
  auVar30._8_4_ = fVar22 * auVar27._8_4_ + fVar52 * auVar35._8_4_;
  auVar30._12_4_ = fVar23 * auVar27._12_4_ + fVar53 * auVar35._12_4_;
  auVar29._0_4_ = fVar19 * auVar60._0_4_ + fVar48 * auVar20._0_4_;
  auVar29._4_4_ = fVar21 * auVar60._4_4_ + fVar51 * auVar20._4_4_;
  auVar29._8_4_ = fVar22 * auVar60._8_4_ + fVar52 * auVar20._8_4_;
  auVar29._12_4_ = fVar23 * auVar60._12_4_ + fVar53 * auVar20._12_4_;
  local_d8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar11 = *(undefined4 *)(ray + k * 4);
  auVar35._4_4_ = uVar11;
  auVar35._0_4_ = uVar11;
  auVar35._8_4_ = uVar11;
  auVar35._12_4_ = uVar11;
  auVar35 = vsubps_avx(auVar26,auVar35);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar27._4_4_ = uVar11;
  auVar27._0_4_ = uVar11;
  auVar27._8_4_ = uVar11;
  auVar27._12_4_ = uVar11;
  auVar30 = vsubps_avx(auVar30,auVar27);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar28._4_4_ = uVar11;
  auVar28._0_4_ = uVar11;
  auVar28._8_4_ = uVar11;
  auVar28._12_4_ = uVar11;
  auVar20 = vsubps_avx(auVar29,auVar28);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar27 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar28 = vshufps_avx(auVar27,auVar27,0);
  auVar27 = vrcpps_avx(auVar28);
  fVar62 = auVar27._0_4_;
  auVar61._0_4_ = fVar62 * auVar28._0_4_;
  fVar64 = auVar27._4_4_;
  auVar61._4_4_ = fVar64 * auVar28._4_4_;
  fVar65 = auVar27._8_4_;
  auVar61._8_4_ = fVar65 * auVar28._8_4_;
  fVar66 = auVar27._12_4_;
  auVar61._12_4_ = fVar66 * auVar28._12_4_;
  auVar27 = vsubps_avx(auVar59,auVar61);
  fVar54 = auVar20._0_4_;
  fVar56 = auVar20._4_4_;
  fVar57 = auVar20._8_4_;
  fVar58 = auVar20._12_4_;
  fVar43 = auVar30._0_4_;
  fVar45 = auVar30._4_4_;
  fVar46 = auVar30._8_4_;
  fVar47 = auVar30._12_4_;
  fVar34 = auVar35._0_4_;
  fVar38 = auVar35._4_4_;
  fVar39 = auVar35._8_4_;
  fVar40 = auVar35._12_4_;
  local_118._0_4_ =
       (fVar34 * fVar1 + fVar43 * fVar2 + fVar54 * fVar3) * (fVar62 + fVar62 * auVar27._0_4_);
  local_118._4_4_ =
       (fVar38 * fVar1 + fVar45 * fVar2 + fVar56 * fVar3) * (fVar64 + fVar64 * auVar27._4_4_);
  local_118._8_4_ =
       (fVar39 * fVar1 + fVar46 * fVar2 + fVar57 * fVar3) * (fVar65 + fVar65 * auVar27._8_4_);
  local_118._12_4_ =
       (fVar40 * fVar1 + fVar47 * fVar2 + fVar58 * fVar3) * (fVar66 + fVar66 * auVar27._12_4_);
  auVar63 = ZEXT1664(local_118);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar60._4_4_ = uVar11;
  auVar60._0_4_ = uVar11;
  auVar60._8_4_ = uVar11;
  auVar60._12_4_ = uVar11;
  auVar27 = vcmpps_avx(auVar60,local_118,2);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar67._4_4_ = uVar11;
  auVar67._0_4_ = uVar11;
  auVar67._8_4_ = uVar11;
  auVar67._12_4_ = uVar11;
  auVar69 = ZEXT1664(auVar67);
  auVar28 = vcmpps_avx(local_118,auVar67,2);
  auVar27 = vandps_avx(auVar28,auVar27);
  auVar28 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar28 = vpcmpgtd_avx(auVar28,_DAT_01f4ad30);
  auVar60 = auVar28 & auVar27;
  if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar60[0xf] < '\0') {
    auVar27 = vandps_avx(auVar27,auVar28);
    auVar28 = vunpckhps_avx(auVar24,auVar25);
    auVar24 = vunpckhps_avx(auVar31,auVar33);
    fVar19 = fVar48 * auVar28._0_4_ + fVar19 * auVar24._0_4_;
    fVar21 = fVar51 * auVar28._4_4_ + fVar21 * auVar24._4_4_;
    fVar22 = fVar52 * auVar28._8_4_ + fVar22 * auVar24._8_4_;
    fVar23 = fVar53 * auVar28._12_4_ + fVar23 * auVar24._12_4_;
    auVar24._0_4_ = local_118._0_4_ * fVar1;
    auVar24._4_4_ = local_118._4_4_ * fVar1;
    auVar24._8_4_ = local_118._8_4_ * fVar1;
    auVar24._12_4_ = local_118._12_4_ * fVar1;
    auVar31._0_4_ = local_118._0_4_ * fVar2;
    auVar31._4_4_ = local_118._4_4_ * fVar2;
    auVar31._8_4_ = local_118._8_4_ * fVar2;
    auVar31._12_4_ = local_118._12_4_ * fVar2;
    auVar33._0_4_ = local_118._0_4_ * fVar3;
    auVar33._4_4_ = local_118._4_4_ * fVar3;
    auVar33._8_4_ = local_118._8_4_ * fVar3;
    auVar33._12_4_ = local_118._12_4_ * fVar3;
    auVar28 = vsubps_avx(auVar35,auVar24);
    auVar35 = vsubps_avx(auVar30,auVar31);
    auVar30 = vsubps_avx(auVar20,auVar33);
    auVar25._0_4_ =
         auVar28._0_4_ * auVar28._0_4_ +
         auVar35._0_4_ * auVar35._0_4_ + auVar30._0_4_ * auVar30._0_4_;
    auVar25._4_4_ =
         auVar28._4_4_ * auVar28._4_4_ +
         auVar35._4_4_ * auVar35._4_4_ + auVar30._4_4_ * auVar30._4_4_;
    auVar25._8_4_ =
         auVar28._8_4_ * auVar28._8_4_ +
         auVar35._8_4_ * auVar35._8_4_ + auVar30._8_4_ * auVar30._8_4_;
    auVar25._12_4_ =
         auVar28._12_4_ * auVar28._12_4_ +
         auVar35._12_4_ * auVar35._12_4_ + auVar30._12_4_ * auVar30._12_4_;
    auVar20._0_4_ = fVar19 * fVar19;
    auVar20._4_4_ = fVar21 * fVar21;
    auVar20._8_4_ = fVar22 * fVar22;
    auVar20._12_4_ = fVar23 * fVar23;
    auVar28 = vcmpps_avx(auVar25,auVar20,2);
    auVar35 = auVar27 & auVar28;
    if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0')
    {
      auVar27 = vandps_avx(auVar27,auVar28);
      auVar32._0_4_ = fVar34 * fVar34 + fVar43 * fVar43 + fVar54 * fVar54;
      auVar32._4_4_ = fVar38 * fVar38 + fVar45 * fVar45 + fVar56 * fVar56;
      auVar32._8_4_ = fVar39 * fVar39 + fVar46 * fVar46 + fVar57 * fVar57;
      auVar32._12_4_ = fVar40 * fVar40 + fVar47 * fVar47 + fVar58 * fVar58;
      auVar28 = vcmpps_avx(auVar32,auVar20,6);
      auVar35 = auVar28 & auVar27;
      if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0'
         ) {
        valid.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar27,auVar28);
        local_138 = ZEXT832(0) << 0x20;
        local_108[0] = -fVar1;
        local_108[1] = -fVar1;
        local_108[2] = -fVar1;
        local_108[3] = -fVar1;
        local_f8[0] = -fVar2;
        local_f8[1] = -fVar2;
        local_f8[2] = -fVar2;
        local_f8[3] = -fVar2;
        local_e8[0] = -fVar3;
        local_e8[1] = -fVar3;
        local_e8[2] = -fVar3;
        local_e8[3] = -fVar3;
        auVar36._8_4_ = 0x7f800000;
        auVar36._0_8_ = 0x7f8000007f800000;
        auVar36._12_4_ = 0x7f800000;
        auVar37 = ZEXT1664(auVar36);
        auVar27 = vblendvps_avx(auVar36,local_118,(undefined1  [16])valid.field_0);
        auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
        auVar28 = vminps_avx(auVar28,auVar27);
        auVar35 = vshufpd_avx(auVar28,auVar28,1);
        auVar28 = vminps_avx(auVar35,auVar28);
        auVar27 = vcmpps_avx(auVar27,auVar28,0);
        auVar28 = (undefined1  [16])valid.field_0 & auVar27;
        aVar9 = valid.field_0;
        if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar28[0xf] < '\0') {
          aVar9 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                  vandps_avx(auVar27,(undefined1  [16])valid.field_0);
        }
        uVar10 = vmovmskps_avx((undefined1  [16])aVar9);
        lVar14 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        auVar41 = vcmpps_avx(ZEXT1632(auVar68),ZEXT1632(auVar68),0xf);
        auVar42 = ZEXT3264(auVar41);
        auVar44 = ZEXT864(0) << 0x20;
        auVar27 = vpcmpeqd_avx(auVar49,auVar49);
        auVar50 = ZEXT1664(auVar27);
        auVar55 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        do {
          args.valid = (int *)local_1a8;
          args.hit = local_c8;
          uVar10 = *(uint *)(local_d8 + lVar14 * 4);
          pRVar12 = (RTCRayN *)(ulong)uVar10;
          pGVar6 = (pSVar5->geometries).items[(long)pRVar12].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1a8 + lVar14 * 4 + -0x10) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar11 = *(undefined4 *)(local_138 + lVar14 * 4);
              uVar4 = *(undefined4 *)(local_138 + lVar14 * 4 + 0x10);
              *(float *)(ray + k * 4 + 0x80) = local_108[lVar14 + -4];
              *(float *)(ray + k * 4 + 0xc0) = local_108[lVar14];
              *(float *)(ray + k * 4 + 0xd0) = local_f8[lVar14];
              *(float *)(ray + k * 4 + 0xe0) = local_e8[lVar14];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar11;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar14];
              *(uint *)(ray + k * 4 + 0x120) = uVar10;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_98 = *(undefined4 *)(local_138 + lVar14 * 4);
            local_88 = *(undefined4 *)(local_138 + lVar14 * 4 + 0x10);
            local_68 = vpshufd_avx(ZEXT416(uVar10),0);
            local_78 = (Disc->primIDs).field_0.i[lVar14];
            fVar1 = local_108[lVar14];
            fVar2 = local_f8[lVar14];
            local_b8._4_4_ = fVar2;
            local_b8._0_4_ = fVar2;
            local_b8._8_4_ = fVar2;
            local_b8._12_4_ = fVar2;
            fVar2 = local_e8[lVar14];
            local_a8._4_4_ = fVar2;
            local_a8._0_4_ = fVar2;
            local_a8._8_4_ = fVar2;
            local_a8._12_4_ = fVar2;
            local_c8[0] = (RTCHitN)SUB41(fVar1,0);
            local_c8[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_c8[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_c8[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_c8[4] = (RTCHitN)SUB41(fVar1,0);
            local_c8[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_c8[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_c8[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_c8[8] = (RTCHitN)SUB41(fVar1,0);
            local_c8[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_c8[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_c8[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_c8[0xc] = (RTCHitN)SUB41(fVar1,0);
            local_c8[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_c8[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_c8[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_84 = local_88;
            uStack_80 = local_88;
            uStack_7c = local_88;
            uStack_74 = local_78;
            uStack_70 = local_78;
            uStack_6c = local_78;
            uStack_54 = context->user->instID[0];
            local_58 = uStack_54;
            uStack_50 = uStack_54;
            uStack_4c = uStack_54;
            uStack_48 = context->user->instPrimID[0];
            uStack_44 = uStack_48;
            uStack_40 = uStack_48;
            uStack_3c = uStack_48;
            *(float *)(ray + k * 4 + 0x80) = local_108[lVar14 + -4];
            local_1a8 = *(undefined1 (*) [16])
                         (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            args.geometryUserPtr = pGVar6->userPtr;
            args.context = context->user;
            args.N = 4;
            pRVar12 = (RTCRayN *)pGVar6->intersectionFilterN;
            auVar28 = auVar63._0_16_;
            auVar68 = auVar69._0_16_;
            auVar27 = auVar55._0_16_;
            args.ray = (RTCRayN *)ray;
            if (pRVar12 != (RTCRayN *)0x0) {
              auVar41 = ZEXT1632(auVar42._0_16_);
              auVar49 = auVar50._0_16_;
              pRVar12 = (RTCRayN *)(*(code *)pRVar12)(&args);
              auVar55 = ZEXT1664(auVar27);
              auVar49 = vpcmpeqd_avx(auVar49,auVar49);
              auVar50 = ZEXT1664(auVar49);
              auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar41 = vcmpps_avx(auVar41,auVar41,0xf);
              auVar42 = ZEXT3264(auVar41);
              auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar69 = ZEXT1664(auVar68);
              auVar63 = ZEXT1664(auVar28);
            }
            auVar49 = auVar50._0_16_;
            if (local_1a8 == (undefined1  [16])0x0) {
              auVar27 = vpcmpeqd_avx(auVar44._0_16_,(undefined1  [16])0x0);
              auVar49 = auVar49 ^ auVar27;
            }
            else {
              pRVar12 = (RTCRayN *)context->args->filter;
              if ((pRVar12 != (RTCRayN *)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                auVar41 = ZEXT1632(auVar42._0_16_);
                pRVar12 = (RTCRayN *)(*(code *)pRVar12)(&args);
                auVar55 = ZEXT1664(auVar27);
                auVar27 = vpcmpeqd_avx(auVar49,auVar49);
                auVar50 = ZEXT1664(auVar27);
                auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar41 = vcmpps_avx(auVar41,auVar41,0xf);
                auVar42 = ZEXT3264(auVar41);
                auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar69 = ZEXT1664(auVar68);
                auVar63 = ZEXT1664(auVar28);
              }
              auVar27 = vpcmpeqd_avx(auVar44._0_16_,local_1a8);
              auVar49 = auVar50._0_16_ ^ auVar27;
              if (local_1a8 != (undefined1  [16])0x0) {
                auVar27 = auVar50._0_16_ ^ auVar27;
                auVar28 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar28;
                auVar28 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar28;
                auVar28 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar28;
                auVar28 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar28;
                auVar28 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar28;
                auVar28 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar28;
                auVar28 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar28;
                auVar28 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar28;
                auVar27 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar27;
                pRVar12 = args.ray;
              }
            }
            if ((auVar55._0_16_ & auVar49) == (undefined1  [16])0x0) {
              *(int *)(ray + k * 4 + 0x80) = auVar69._0_4_;
            }
            else {
              auVar69 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_1a8 + lVar14 * 4 + -0x10) = 0;
            auVar27 = vshufps_avx(auVar69._0_16_,auVar69._0_16_,0);
            auVar27 = vcmpps_avx(auVar63._0_16_,auVar27,2);
            valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                 vandps_avx(auVar27,(undefined1  [16])valid.field_0);
          }
          if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0 &&
               ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
               (undefined1  [16])0x0) &&
              ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) {
            return;
          }
          auVar27 = vblendvps_avx(auVar37._0_16_,auVar63._0_16_,(undefined1  [16])valid.field_0);
          auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
          auVar28 = vminps_avx(auVar28,auVar27);
          auVar68 = vshufpd_avx(auVar28,auVar28,1);
          auVar28 = vminps_avx(auVar68,auVar28);
          auVar27 = vcmpps_avx(auVar27,auVar28,0);
          auVar28 = (undefined1  [16])valid.field_0 & auVar27;
          aVar9 = valid.field_0;
          if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar28[0xf] < '\0') {
            aVar9.v = (__m128)vandps_avx(auVar27,valid.field_0);
          }
          uVar11 = vmovmskps_avx((undefined1  [16])aVar9);
          uVar13 = CONCAT44((int)((ulong)pRVar12 >> 0x20),uVar11);
          lVar14 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }